

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O0

vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *
cnn::AllocateShadowLookupParameters(Model *m)

{
  bool bVar1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *this;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *this_00;
  Model *in_RSI;
  LookupParameters *in_RDI;
  LookupParameters **p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range1;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *v;
  LookupParameters *__args;
  __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  in_stack_ffffffffffffffc8;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
  *in_stack_ffffffffffffffd0;
  
  __args = in_RDI;
  std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::vector
            ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
             0x52b765);
  this = Model::lookup_parameters_list(in_RSI);
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::size(this);
  std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::reserve
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  this_00 = Model::lookup_parameters_list(in_RSI);
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin(this_00);
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                             *)this_00), bVar1) {
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator*((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                 *)&stack0xffffffffffffffc8);
    std::vector<cnn::ShadowLookupParameters,std::allocator<cnn::ShadowLookupParameters>>::
    emplace_back<cnn::LookupParameters&>
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               this,__args);
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator++((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return (vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)__args
  ;
}

Assistant:

vector<ShadowLookupParameters> AllocateShadowLookupParameters(const Model& m) {
  vector<ShadowLookupParameters> v;
  v.reserve(m.lookup_parameters_list().size());
  for (auto& p : m.lookup_parameters_list())
    v.emplace_back(*p);
  return v;
}